

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_db_filename(sqlite3 *db,char *zDbName)

{
  Btree *pBVar1;
  Pager *pPVar2;
  uint uVar3;
  
  if (zDbName == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = sqlite3FindDbName(db,zDbName);
    if ((int)uVar3 < 0) {
      return (char *)0x0;
    }
  }
  pBVar1 = db->aDb[uVar3].pBt;
  if (pBVar1 == (Btree *)0x0) {
    return (char *)0x0;
  }
  pPVar2 = pBVar1->pBt->pPager;
  if (pPVar2->memDb == '\0') {
    return pPVar2->zFilename;
  }
  return "";
}

Assistant:

SQLITE_API const char *sqlite3_db_filename(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeGetFilename(pBt) : 0;
}